

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

string * __thiscall
dap::BasicTypeInfo<std::vector<dap::Variable,std::allocator<dap::Variable>>>::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)((long)this + 8),
             *(long *)((long)this + 0x10) + *(long *)((long)this + 8));
  return __return_storage_ptr__;
}

Assistant:

inline std::string name() const override { return name_; }